

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O3

int xmlBufSetInputBaseCur(xmlBufPtr buf,xmlParserInputPtr input,size_t base,size_t cur)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  xmlChar *pxVar5;
  xmlChar *pxVar6;
  
  if (input != (xmlParserInputPtr)0x0) {
    if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
      pxVar6 = "";
      input->end = "";
      input->cur = "";
      iVar1 = -1;
      lVar4 = 0x18;
    }
    else {
      uVar2 = (ulong)buf->compat_size;
      if ((uVar2 < 0x7fffffff) && (buf->size != uVar2)) {
        buf->size = uVar2;
      }
      uVar3 = (ulong)buf->compat_use;
      uVar2 = buf->use;
      if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
        buf->use = uVar3;
        uVar2 = uVar3;
      }
      pxVar6 = buf->content;
      pxVar5 = pxVar6 + base;
      input->base = pxVar5;
      input->cur = pxVar5 + cur;
      pxVar6 = pxVar6 + uVar2;
      iVar1 = 0;
      lVar4 = 0x28;
    }
    *(xmlChar **)((long)&input->buf + lVar4) = pxVar6;
    return iVar1;
  }
  return -1;
}

Assistant:

int
xmlBufSetInputBaseCur(xmlBufPtr buf, xmlParserInputPtr input,
                      size_t base, size_t cur) {
    if (input == NULL)
        return(-1);
    if ((buf == NULL) || (buf->error)) {
        input->base = input->cur = input->end = BAD_CAST "";
        return(-1);
    }
    CHECK_COMPAT(buf)
    input->base = &buf->content[base];
    input->cur = input->base + cur;
    input->end = &buf->content[buf->use];
    return(0);
}